

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
* __thiscall
Catch::
createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
          (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
           *__return_storage_ptr__,Catch *this,
          set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
          *container,size_t shardCount,size_t shardIndex)

{
  ulong uVar1;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __first;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __last;
  ulong uVar2;
  long lVar3;
  ulong uVar5;
  long lVar6;
  size_t sVar4;
  ulong uVar7;
  
  if (container ==
      (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
       *)0x1) {
    std::
    _Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::_Rb_tree(&__return_storage_ptr__->_M_t,
               (_Rb_tree<const_Catch::TestCaseHandle_*,_const_Catch::TestCaseHandle_*,_std::_Identity<const_Catch::TestCaseHandle_*>,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                *)this);
  }
  else {
    __last._M_node = *(_Base_ptr *)(this + 0x18);
    uVar1 = *(ulong *)(this + 0x28) / (ulong)container;
    uVar2 = *(ulong *)(this + 0x28) % (ulong)container;
    sVar4 = shardCount;
    if (uVar2 < shardCount) {
      sVar4 = uVar2;
    }
    lVar3 = sVar4 + uVar1 * shardCount;
    uVar5 = shardCount + 1;
    uVar7 = uVar5;
    if (uVar2 < uVar5) {
      uVar7 = uVar2;
    }
    lVar6 = uVar7 + uVar1 * uVar5;
    __first._M_node = __last._M_node;
    if (lVar3 < 1) {
      for (; lVar3 != 0; lVar3 = lVar3 + 1) {
        __first._M_node = (_Base_ptr)std::_Rb_tree_decrement(__first._M_node);
      }
    }
    else {
      do {
        __first._M_node = (_Base_ptr)std::_Rb_tree_increment(__first._M_node);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if (lVar6 < 1) {
      for (; lVar6 != 0; lVar6 = lVar6 + 1) {
        __last._M_node = (_Base_ptr)std::_Rb_tree_decrement(__last._M_node);
      }
    }
    else {
      do {
        __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node);
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    std::
    set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
    ::set<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
              ((set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                *)__return_storage_ptr__,__first,__last);
  }
  return __return_storage_ptr__;
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }